

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::get_subpass_meta_for_render_pass_hash
          (Impl *this,Hash render_pass_hash,uint32_t subpass,SubpassMeta *meta)

{
  bool bVar1;
  pointer pvVar2;
  const_reference pvVar3;
  bool bVar4;
  uint local_44;
  _Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>,_false>
  _Stack_40;
  uint32_t mask;
  _Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>,_false>
  local_38;
  const_iterator itr;
  SubpassMeta *meta_local;
  Hash HStack_20;
  uint32_t subpass_local;
  Hash render_pass_hash_local;
  Impl *this_local;
  
  itr.
  super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>,_false>
             )(_Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>,_false>
               )meta;
  HStack_20 = render_pass_hash;
  render_pass_hash_local = (Hash)this;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>_>_>
       ::find(&this->render_pass_hash_to_subpass_meta,&stack0xffffffffffffffe0);
  _Stack_40._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>_>_>
       ::end(&this->render_pass_hash_to_subpass_meta);
  bVar1 = std::__detail::operator!=(&local_38,&stack0xffffffffffffffc0);
  bVar4 = false;
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>,_false,_false>
                           *)&local_38);
    bVar4 = subpass < (pvVar2->second).subpass_count;
  }
  if (bVar4) {
    if (subpass < 0x10) {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>,_false,_false>
                             *)&local_38);
      local_44 = (pvVar2->second).embedded >> ((byte)(subpass << 1) & 0x1f);
    }
    else {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>,_false,_false>
                             *)&local_38);
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&(pvVar2->second).fallback,(ulong)(subpass - 0x10 >> 4));
      local_44 = *pvVar3 >> (sbyte)((subpass & 0xf) << 1);
    }
    *(bool *)itr.
             super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>,_false>
             ._M_cur = (local_44 & 1) != 0;
    *(bool *)((long)itr.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>,_false>
                    ._M_cur + 1) = (local_44 & 2) != 0;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::Impl::get_subpass_meta_for_render_pass_hash(Hash render_pass_hash, uint32_t subpass,
                                                                SubpassMeta *meta) const
{
	auto itr = render_pass_hash_to_subpass_meta.find(render_pass_hash);
	if (itr != render_pass_hash_to_subpass_meta.end() && subpass < itr->second.subpass_count)
	{
		uint32_t mask;
		if (subpass < 16)
			mask = itr->second.embedded >> (2 * subpass);
		else
			mask = itr->second.fallback[(subpass - 16) / 16] >> (2 * (subpass & 15));
		meta->uses_color = (mask & 1) != 0;
		meta->uses_depth_stencil = (mask & 2) != 0;
		return true;
	}
	else
		return false;
}